

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuX11GlxPlatform.cpp
# Opt level: O3

void __thiscall tcu::x11::glx::GlxRenderContext::makeCurrent(GlxRenderContext *this)

{
  int iVar1;
  TestError *this_00;
  
  iVar1 = (*((this->m_glxDrawable).
             super_UniqueBase<tcu::x11::glx::GlxDrawable,_de::DefaultDeleter<tcu::x11::glx::GlxDrawable>_>
             .m_data.ptr)->_vptr_GlxDrawable[5])();
  iVar1 = glXMakeContextCurrent
                    ((this->m_glxDisplay).super_XlibDisplay.m_display,iVar1,iVar1,this->m_GLXContext
                    );
  if (iVar1 != 0) {
    return;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  TestError::TestError
            (this_00,"GLX call failed",
             "glXMakeContextCurrent(m_glxDisplay.getXDisplay(), drawRead, drawRead, m_GLXContext)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/platform/X11/tcuX11GlxPlatform.cpp"
             ,0x2bf);
  __cxa_throw(this_00,&TestError::typeinfo,Exception::~Exception);
}

Assistant:

void GlxRenderContext::makeCurrent (void)
{
	const GLXDrawable drawRead = m_glxDrawable->getGLXDrawable();
	TCU_CHECK_GLX(glXMakeContextCurrent(m_glxDisplay.getXDisplay(),
										drawRead, drawRead, m_GLXContext));
}